

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# byte_buffer_test.cpp
# Opt level: O0

void __thiscall
bidfx_public_api::tools::ByteBufferTest_test_read_write_float_Test::TestBody
          (ByteBufferTest_test_read_write_float_Test *this)

{
  bool bVar1;
  char *pcVar2;
  AssertHelper local_e0;
  Message local_d8;
  float local_cc;
  undefined1 local_c8 [8];
  AssertionResult gtest_ar_1;
  ByteBuffer byte_buffer2;
  float local_84;
  float float2;
  Message local_78;
  float local_6c;
  undefined1 local_68 [8];
  AssertionResult gtest_ar;
  ByteBuffer local_48 [8];
  ByteBuffer byte_buffer1;
  float local_14;
  ByteBufferTest_test_read_write_float_Test *pBStack_10;
  float float1;
  ByteBufferTest_test_read_write_float_Test *this_local;
  
  local_14 = 4334.32;
  pBStack_10 = this;
  bidfx_public_api::tools::ByteBuffer::ByteBuffer(local_48,4);
  bidfx_public_api::tools::ByteBuffer::WriteFloat(local_14);
  local_6c = (float)bidfx_public_api::tools::ByteBuffer::ReadFloat();
  testing::internal::EqHelper<false>::Compare<float,float>
            ((EqHelper<false> *)local_68,"float1","byte_buffer1.ReadFloat()",&local_14,&local_6c);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_68);
  if (!bVar1) {
    testing::Message::Message(&local_78);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_68);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&stack0xffffffffffffff80,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bidfx[P]bidfx-api-cpp/test/tools/byte_buffer_test.cpp"
               ,0xb1,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&stack0xffffffffffffff80,&local_78);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&stack0xffffffffffffff80);
    testing::Message::~Message(&local_78);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_68);
  local_84 = -435.32;
  bidfx_public_api::tools::ByteBuffer::ByteBuffer((ByteBuffer *)&gtest_ar_1.message_,4);
  bidfx_public_api::tools::ByteBuffer::WriteFloat(local_84);
  local_cc = (float)bidfx_public_api::tools::ByteBuffer::ReadFloat();
  testing::internal::EqHelper<false>::Compare<float,float>
            ((EqHelper<false> *)local_c8,"float2","byte_buffer2.ReadFloat()",&local_84,&local_cc);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_c8);
  if (!bVar1) {
    testing::Message::Message(&local_d8);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_c8);
    testing::internal::AssertHelper::AssertHelper
              (&local_e0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bidfx[P]bidfx-api-cpp/test/tools/byte_buffer_test.cpp"
               ,0xb6,pcVar2);
    testing::internal::AssertHelper::operator=(&local_e0,&local_d8);
    testing::internal::AssertHelper::~AssertHelper(&local_e0);
    testing::Message::~Message(&local_d8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_c8);
  bidfx_public_api::tools::ByteBuffer::~ByteBuffer((ByteBuffer *)&gtest_ar_1.message_);
  bidfx_public_api::tools::ByteBuffer::~ByteBuffer(local_48);
  return;
}

Assistant:

TEST(ByteBufferTest, test_read_write_float)
{
    float float1 = 4334.32f;
    ByteBuffer byte_buffer1(4);
    byte_buffer1.WriteFloat(float1);
    EXPECT_EQ(float1, byte_buffer1.ReadFloat());

    float float2 = -435.32f;
    ByteBuffer byte_buffer2(4);
    byte_buffer2.WriteFloat(float2);
    EXPECT_EQ(float2, byte_buffer2.ReadFloat());
}